

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

void __thiscall
kj::_::BTreeImpl::renumber(BTreeImpl *this,uint oldRow,uint newRow,SearchKey *searchKey)

{
  bool bVar1;
  char acVar2 [7];
  NodeUnion *pNVar3;
  ulong uVar4;
  size_t sVar5;
  undefined4 in_register_00000034;
  StringPtr end;
  uint r;
  Leaf *leaf;
  Fault local_98;
  Fault f;
  uint *local_88;
  undefined1 local_80 [8];
  DebugComparison<unsigned_int_&,_int>_conflict2 _kjCondition;
  uint indexInParent;
  Parent *node;
  Iterator local_40;
  uint i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_int> *__range2;
  SearchKey *pSStack_20;
  uint pos;
  SearchKey *searchKey_local;
  uint newRow_local;
  uint oldRow_local;
  BTreeImpl *this_local;
  
  end.content.size_._4_4_ = in_register_00000034;
  end.content.size_._0_4_ = oldRow;
  __range2._4_4_ = 0;
  end.content.ptr = (char *)(ulong)this->height;
  pSStack_20 = searchKey;
  searchKey_local._0_4_ = newRow;
  searchKey_local._4_4_ = oldRow;
  _newRow_local = this;
  ___end2 = zeroTo<unsigned_int>(end);
  i = (uint)Range<unsigned_int>::begin((Range<unsigned_int> *)&__end2);
  local_40 = Range<unsigned_int>::end((Range<unsigned_int> *)&__end2);
  while( true ) {
    bVar1 = Range<unsigned_int>::Iterator::operator==((Iterator *)&i,&local_40);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pNVar3 = this->tree + __range2._4_4_;
      acVar2 = (*pSStack_20->_vptr_SearchKey[1])(pSStack_20,pNVar3);
      bVar1 = MaybeUint::operator==
                        ((MaybeUint *)((long)&pNVar3->field_0 + (ulong)acVar2._0_4_ * 4 + 8),
                         searchKey_local._4_4_);
      if (bVar1) {
        MaybeUint::operator=
                  ((MaybeUint *)((long)&pNVar3->field_0 + (ulong)acVar2._0_4_ * 4 + 8),
                   (uint)searchKey_local);
      }
      else {
        logInconsistency(this);
      }
      return;
    }
    Range<unsigned_int>::Iterator::operator*((Iterator *)&i);
    pNVar3 = this->tree + __range2._4_4_;
    acVar2 = (**pSStack_20->_vptr_SearchKey)(pSStack_20,pNVar3);
    _kjCondition._36_4_ = acVar2._0_4_;
    __range2._4_4_ = *(uint *)((long)&pNVar3->field_0 + (ulong)(uint)_kjCondition._36_4_ * 4 + 0x20)
    ;
    uVar4 = (ulong)(uint)_kjCondition._36_4_;
    sVar5 = size<kj::_::BTreeImpl::MaybeUint,7ul>((MaybeUint (*) [7])((long)&pNVar3->field_0 + 4));
    if ((uVar4 < sVar5) &&
       (bVar1 = MaybeUint::operator==
                          ((MaybeUint *)
                           ((long)&pNVar3->field_0 + (ulong)(uint)_kjCondition._36_4_ * 4 + 4),
                           searchKey_local._4_4_), bVar1)) {
      MaybeUint::operator=
                ((MaybeUint *)((long)&pNVar3->field_0 + (ulong)(uint)_kjCondition._36_4_ * 4 + 4),
                 (uint)searchKey_local);
    }
    local_88 = (uint *)DebugExpressionStart::operator<<
                                 ((DebugExpressionStart *)&_::MAGIC_ASSERT,
                                  (uint *)((long)&__range2 + 4));
    f.exception._4_4_ = 0;
    DebugExpression<unsigned_int&>::operator!=
              ((DebugComparison<unsigned_int_&,_int> *)local_80,
               (DebugExpression<unsigned_int&> *)&local_88,(int *)((long)&f.exception + 4));
    bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_80);
    if (!bVar1) break;
    Range<unsigned_int>::Iterator::operator++((Iterator *)&i);
  }
  Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&>
            (&local_98,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
             ,0x24a,FAILED,"pos != 0","_kjCondition,",
             (DebugComparison<unsigned_int_&,_int> *)local_80);
  Debug::Fault::fatal(&local_98);
}

Assistant:

void BTreeImpl::renumber(uint oldRow, uint newRow, const SearchKey& searchKey) {
  // Renumber the given row from oldRow to newRow. predicate() returns true for oldRow and all
  // rows after it. (It will not be called on newRow.)

  uint pos = 0;

  for (auto i KJ_UNUSED: zeroTo(height)) {
    auto& node = tree[pos].parent;
    uint indexInParent = searchKey.search(node);
    pos = node.children[indexInParent];
    if (indexInParent < kj::size(node.keys) && node.keys[indexInParent] == oldRow) {
      node.keys[indexInParent] = newRow;
    }
    KJ_DASSERT(pos != 0);
  }

  auto& leaf = tree[pos].leaf;
  uint r = searchKey.search(leaf);
  if (leaf.rows[r] == oldRow) {
    leaf.rows[r] = newRow;
  } else {
    logInconsistency();
  }
}